

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_SubDimple::IsValidLevel
          (ON_SubDimple *this,ON_SubD *subd,uint level_index,bool bSilentError,ON_TextLog *text_log)

{
  ON_SubDLevel *this_00;
  element_type *peVar1;
  ON_SubDVertex *pOVar2;
  ON_SubDEdge *pOVar3;
  ON_SubDFace *pOVar4;
  unsigned_short level;
  undefined8 uVar5;
  byte bVar6;
  int iVar7;
  ON_SubDFacePtr *pOVar8;
  ON_SubDEdgePtr *pOVar9;
  ulong uVar10;
  ON_SubDLevel *pOVar11;
  ON_SubDVertex *pOVar12;
  ON_SubDFacePtr *pOVar13;
  ON_SubDEdge *pOVar14;
  ON__UINT_PTR OVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ON_SubDFace *pOVar19;
  ON_SubDEdgePtr *pOVar20;
  bool bVar21;
  bool bVar22;
  uint f_id_range [2];
  uint e_id_range [2];
  uint v_id_range [2];
  ON_SubDVertexIterator vit;
  uint local_9c;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  uint local_6c;
  undefined1 local_68 [32];
  ON_SubDVertex *local_48;
  uint local_40;
  
  if ((((level_index < 0xffff) && (level_index < (uint)(this->m_levels).m_count)) &&
      (this_00 = (this->m_levels).m_a[level_index], this_00 != (ON_SubDLevel *)0x0)) &&
     (local_9c = ON_SubDLevel::ClearComponentDamagedState(this_00,true,true,true),
     this_00->m_level_index == level_index)) {
    if (level_index == 0) {
      if ((2 < this_00->m_vertex_count) && (2 < this_00->m_edge_count)) {
        if (this_00->m_face_count != 0) goto LAB_005d9204;
        goto LAB_005d9313;
      }
      goto LAB_005d92f0;
    }
    pOVar11 = (this->m_levels).m_a[level_index - 1];
    if (((pOVar11 == (ON_SubDLevel *)0x0) || (this_00->m_vertex_count <= pOVar11->m_vertex_count))
       || ((this_00->m_edge_count <= pOVar11->m_edge_count ||
           (this_00->m_face_count <= pOVar11->m_face_count)))) {
      ON_SubDIncrementErrorCount();
      if (bSilentError) {
        bVar21 = false;
        pOVar11 = (ON_SubDLevel *)0x0;
      }
      else {
        bVar21 = false;
        bVar22 = ON_IsNotValid();
        pOVar11 = (ON_SubDLevel *)(ulong)bVar22;
      }
    }
    else {
      bVar21 = true;
    }
    local_9c = (uint)pOVar11;
    bVar6 = (byte)pOVar11;
    if (!bVar21) goto LAB_005d92fb;
LAB_005d9204:
    if (this_00->m_vertex[0] == (ON_SubDVertex *)0x0) {
LAB_005d9313:
      ON_SubDIncrementErrorCount();
      goto joined_r0x005d931b;
    }
    if ((((this_00->m_edge[0] == (ON_SubDEdge *)0x0) || (this_00->m_face[0] == (ON_SubDFace *)0x0))
        || (this_00->m_vertex[1] == (ON_SubDVertex *)0x0)) ||
       ((this_00->m_edge[1] == (ON_SubDEdge *)0x0 || (this_00->m_face[1] == (ON_SubDFace *)0x0))))
    goto LAB_005d92f0;
    local_80 = -1;
    local_88 = -1;
    local_90 = -1;
    peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar1 == (element_type *)0x0) ||
       (pOVar11 = peVar1->m_active_level, pOVar11 == (ON_SubDLevel *)0x0)) {
      pOVar11 = &ON_SubDLevel::Empty;
    }
    if (pOVar11->m_level_index == level_index) {
      if ((peVar1 == (element_type *)0x0) ||
         (pOVar11 = peVar1->m_active_level, pOVar11 == (ON_SubDLevel *)0x0)) {
        pOVar11 = &ON_SubDLevel::Empty;
      }
      if (pOVar11->m_vertex[0] == this_00->m_vertex[0]) {
        ON_SubDVertexIterator::ON_SubDVertexIterator((ON_SubDVertexIterator *)local_68,subd);
        uVar5 = local_68._16_8_;
        local_40 = 0;
        local_48 = (ON_SubDVertex *)local_68._16_8_;
        local_78 = this_00->m_vertex[0];
        if ((ON_SubDVertex *)local_68._16_8_ != local_78) {
          ON_SubDIncrementErrorCount();
          if (bSilentError) {
            local_9c = 0;
          }
          else {
            bVar21 = ON_IsNotValid();
            local_9c = (uint)bVar21;
          }
        }
        bVar6 = (byte)local_9c;
        ON_SubDRef::~ON_SubDRef((ON_SubDRef *)local_68);
        if ((ON_SubDVertex *)uVar5 != local_78) goto LAB_005d92fb;
        goto LAB_005d9356;
      }
      goto LAB_005d9459;
    }
LAB_005d9356:
    uVar16 = this_00->m_vertex_count;
    bVar21 = this_00->m_vertex[0] != (ON_SubDVertex *)0x0;
    if (uVar16 == 0 || !bVar21) {
      bVar22 = true;
      uVar17 = 0;
      pOVar12 = (ON_SubDVertex *)0x0;
    }
    else {
      iVar7 = 0;
      local_78 = (ON_SubDVertex *)(CONCAT44(local_78._4_4_,level_index) & 0xffffffff0000ffff);
      uVar17 = 0;
      pOVar2 = this_00->m_vertex[0];
      local_6c = (uint)bSilentError;
      do {
        pOVar12 = pOVar2;
        bVar6 = 0;
        bVar21 = IsValidSubDVertex(pOVar12,(unsigned_short)local_78,(uint *)0x0,
                                   (unsigned_short)local_6c,SUB81(text_log,0));
        if (!bVar21) goto LAB_005d92fb;
        uVar16 = (pOVar12->super_ON_SubDComponentBase).m_id;
        if (uVar17 == 0) {
          local_80 = (ulong)uVar16 << 0x20;
LAB_005d93d4:
          local_80 = CONCAT44(local_80._4_4_,uVar16);
        }
        else {
          if (uVar16 < (uint)local_80) goto LAB_005d93d4;
          if (local_80._4_4_ < uVar16) {
            local_80 = CONCAT44(uVar16,(uint)local_80);
          }
        }
        iVar7 = iVar7 + (uint)(pOVar12->m_edge_count == 0);
        uVar17 = uVar17 + 1;
        pOVar2 = pOVar12->m_next_vertex;
        uVar16 = this_00->m_vertex_count;
        bVar21 = pOVar2 != (ON_SubDVertex *)0x0;
      } while ((uVar17 < uVar16) && (pOVar2 != (ON_SubDVertex *)0x0));
      bVar22 = iVar7 == 0;
    }
    if (this_00->m_vertex[1] != pOVar12) goto LAB_005d9417;
    if ((bool)(uVar17 != uVar16 | bVar21)) {
LAB_005d9459:
      ON_SubDIncrementErrorCount();
    }
    else {
      if (((local_80._4_4_ - (uint)local_80) + 1 < uVar16) ||
         ((this->m_heap).m_max_vertex_id < local_80._4_4_)) goto LAB_005d9459;
      if (bVar22) {
        peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if ((peVar1 == (element_type *)0x0) ||
           (pOVar11 = peVar1->m_active_level, pOVar11 == (ON_SubDLevel *)0x0)) {
          pOVar11 = &ON_SubDLevel::Empty;
        }
        if (pOVar11->m_level_index == level_index) {
          if ((peVar1 == (element_type *)0x0) ||
             (pOVar11 = peVar1->m_active_level, pOVar11 == (ON_SubDLevel *)0x0)) {
            pOVar11 = &ON_SubDLevel::Empty;
          }
          if (pOVar11->m_edge[0] != this_00->m_edge[0]) goto LAB_005d9417;
          ON_SubDEdgeIterator::ON_SubDEdgeIterator((ON_SubDEdgeIterator *)local_68,subd);
          uVar5 = local_68._16_8_;
          local_40 = 0;
          local_48 = (ON_SubDVertex *)local_68._16_8_;
          pOVar12 = (ON_SubDVertex *)this_00->m_edge[0];
          if ((ON_SubDVertex *)local_68._16_8_ != pOVar12) {
            ON_SubDIncrementErrorCount();
            if (bSilentError) {
              local_9c = 0;
            }
            else {
              bVar21 = ON_IsNotValid();
              local_9c = (uint)bVar21;
            }
          }
          bVar6 = (byte)local_9c;
          ON_SubDRef::~ON_SubDRef((ON_SubDRef *)local_68);
          if ((ON_SubDVertex *)uVar5 != pOVar12) goto LAB_005d92fb;
        }
        uVar16 = this_00->m_edge_count;
        bVar21 = this_00->m_edge[0] != (ON_SubDEdge *)0x0;
        uVar17 = 0;
        level = (unsigned_short)level_index;
        if (uVar16 == 0 || !bVar21) {
          pOVar14 = (ON_SubDEdge *)0x0;
          uVar17 = 0;
        }
        else {
          local_78 = (ON_SubDVertex *)CONCAT44(local_78._4_4_,(uint)bSilentError);
          pOVar3 = this_00->m_edge[0];
          do {
            pOVar14 = pOVar3;
            bVar6 = 0;
            bVar21 = IsValidSubDEdge(pOVar14,level,(uint *)0x0,SUB81(local_78,0));
            if (!bVar21) goto LAB_005d92fb;
            uVar16 = (pOVar14->super_ON_SubDComponentBase).m_id;
            if (uVar17 == 0) {
              local_88 = (ulong)uVar16 << 0x20;
LAB_005d959b:
              local_88 = CONCAT44(local_88._4_4_,uVar16);
            }
            else {
              if (uVar16 < (uint)local_88) goto LAB_005d959b;
              if (local_88._4_4_ < uVar16) {
                local_88 = CONCAT44(uVar16,(uint)local_88);
              }
            }
            uVar17 = uVar17 + 1;
            pOVar3 = pOVar14->m_next_edge;
            uVar16 = this_00->m_edge_count;
            bVar21 = pOVar3 != (ON_SubDEdge *)0x0;
          } while ((uVar17 < uVar16) && (pOVar3 != (ON_SubDEdge *)0x0));
        }
        if (!(bool)(uVar17 != uVar16 | bVar21)) {
          if (((uVar16 <= (local_88._4_4_ - (uint)local_88) + 1) && (this_00->m_edge[1] == pOVar14))
             && (local_88._4_4_ <= (this->m_heap).m_max_edge_id)) {
            peVar1 = (subd->m_subdimple_sp).
                     super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if ((peVar1 == (element_type *)0x0) ||
               (pOVar11 = peVar1->m_active_level, pOVar11 == (ON_SubDLevel *)0x0)) {
              pOVar11 = &ON_SubDLevel::Empty;
            }
            if (pOVar11->m_level_index == level_index) {
              if ((peVar1 == (element_type *)0x0) ||
                 (pOVar11 = peVar1->m_active_level, pOVar11 == (ON_SubDLevel *)0x0)) {
                pOVar11 = &ON_SubDLevel::Empty;
              }
              if (pOVar11->m_face[0] != this_00->m_face[0]) goto LAB_005d9417;
              ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)local_68,subd);
              local_40 = 0;
              local_48 = (ON_SubDVertex *)local_68._16_8_;
              pOVar12 = (ON_SubDVertex *)this_00->m_face[0];
              if ((ON_SubDVertex *)local_68._16_8_ != pOVar12) {
                ON_SubDIncrementErrorCount();
                if (bSilentError) {
                  local_9c = 0;
                }
                else {
                  bVar21 = ON_IsNotValid();
                  local_9c = (uint)bVar21;
                }
              }
              ON_SubDRef::~ON_SubDRef((ON_SubDRef *)local_68);
              bVar6 = (byte)local_9c;
              if ((ON_SubDVertex *)local_68._16_8_ != pOVar12) goto LAB_005d92fb;
            }
            uVar16 = this_00->m_face_count;
            bVar21 = this_00->m_face[0] != (ON_SubDFace *)0x0;
            uVar17 = 0;
            if (uVar16 == 0 || !bVar21) {
              pOVar19 = (ON_SubDFace *)0x0;
            }
            else {
              pOVar4 = this_00->m_face[0];
              do {
                pOVar19 = pOVar4;
                bVar6 = 0;
                bVar21 = IsValidSubDFace(pOVar19,level,(uint *)0x0,(ushort)bSilentError,
                                         SUB81(text_log,0));
                if (!bVar21) goto LAB_005d92fb;
                uVar16 = (pOVar19->super_ON_SubDComponentBase).m_id;
                if (uVar17 == 0) {
                  local_90 = (ulong)uVar16 << 0x20;
LAB_005d970f:
                  local_90 = CONCAT44(local_90._4_4_,uVar16);
                }
                else {
                  if (uVar16 < (uint)local_90) goto LAB_005d970f;
                  if (local_90._4_4_ < uVar16) {
                    local_90 = CONCAT44(uVar16,(uint)local_90);
                  }
                }
                uVar17 = uVar17 + 1;
                pOVar4 = pOVar19->m_next_face;
                uVar16 = this_00->m_face_count;
                bVar21 = pOVar4 != (ON_SubDFace *)0x0;
              } while ((uVar17 < uVar16) && (pOVar4 != (ON_SubDFace *)0x0));
            }
            if (!(bool)(uVar17 != uVar16 | bVar21)) {
              if (((uVar16 <= (local_90._4_4_ - (uint)local_90) + 1) &&
                  (this_00->m_face[1] == pOVar19)) &&
                 (local_90._4_4_ <= (this->m_heap).m_max_face_id)) {
                pOVar12 = this_00->m_vertex[0];
                if (pOVar12 != (ON_SubDVertex *)0x0) {
                  do {
                    if (pOVar12->m_edge_count != 0) {
                      uVar18 = 0;
                      do {
                        pOVar14 = (ON_SubDEdge *)
                                  (pOVar12->m_edges[uVar18].m_ptr & 0xfffffffffffffff8);
                        bVar21 = IsValidSubDEdge(pOVar14,level,(uint *)&local_88,bSilentError);
                        if (!bVar21) goto LAB_005d92f9;
                        if (uVar18 < pOVar12->m_edge_count) {
                          OVar15 = (ON__UINT_PTR)((uint)pOVar12->m_edges[uVar18].m_ptr & 1);
                        }
                        else {
                          OVar15 = 0;
                        }
                        bVar21 = IsValidVertexEdgeLink(pOVar12,pOVar14,OVar15,bSilentError);
                        if (!bVar21) goto LAB_005d92f9;
                        uVar18 = uVar18 + 1;
                      } while (uVar18 < pOVar12->m_edge_count);
                    }
                    if (pOVar12->m_face_count != 0) {
                      uVar18 = 0;
                      do {
                        pOVar19 = pOVar12->m_faces[uVar18];
                        bVar21 = IsValidSubDFace(pOVar19,level,(uint *)&local_90,
                                                 (ushort)bSilentError,SUB81(text_log,0));
                        if (!bVar21) goto LAB_005d92f9;
                        text_log = (ON_TextLog *)(ulong)bSilentError;
                        bVar21 = IsValidVertexFaceLink
                                           (pOVar12,pOVar19,(uint)uVar18,0xffffffff,bSilentError);
                        if (!bVar21) goto LAB_005d92f9;
                        uVar18 = uVar18 + 1;
                      } while (uVar18 < pOVar12->m_face_count);
                    }
                    pOVar12 = pOVar12->m_next_vertex;
                  } while (pOVar12 != (ON_SubDVertex *)0x0);
                }
                pOVar14 = this_00->m_edge[0];
                if (pOVar14 != (ON_SubDEdge *)0x0) {
                  do {
                    OVar15 = 0;
                    do {
                      pOVar12 = pOVar14->m_vertex[OVar15];
                      bVar21 = IsValidSubDVertex(pOVar12,level,(uint *)&local_80,
                                                 (ushort)bSilentError,SUB81(text_log,0));
                      if ((!bVar21) ||
                         (bVar21 = IsValidVertexEdgeLink(pOVar12,pOVar14,OVar15,bSilentError),
                         !bVar21)) goto LAB_005d92f9;
                      OVar15 = OVar15 + 1;
                    } while (OVar15 == 1);
                    if (pOVar14->m_face_count != 0) {
                      pOVar13 = pOVar14->m_face2;
                      uVar18 = 0;
                      do {
                        pOVar8 = pOVar13;
                        if (1 < uVar18) {
                          pOVar8 = pOVar14->m_facex + (uVar18 - 2);
                        }
                        pOVar19 = (ON_SubDFace *)(pOVar8->m_ptr & 0xfffffffffffffff8);
                        bVar21 = IsValidSubDFace(pOVar19,level,(uint *)&local_90,
                                                 (ushort)bSilentError,SUB81(text_log,0));
                        if (!bVar21) goto LAB_005d92f9;
                        text_log = (ON_TextLog *)(ulong)bSilentError;
                        bVar21 = IsValidEdgeFaceLink(pOVar14,pOVar19,(uint)uVar18,0xffffffff,
                                                     bSilentError);
                        if (!bVar21) goto LAB_005d92f9;
                        uVar18 = uVar18 + 1;
                        pOVar13 = pOVar13 + 1;
                      } while (uVar18 < pOVar14->m_face_count);
                    }
                    pOVar14 = pOVar14->m_next_edge;
                  } while (pOVar14 != (ON_SubDEdge *)0x0);
                }
                pOVar19 = this_00->m_face[0];
                if (pOVar19 != (ON_SubDFace *)0x0) {
                  do {
                    if (pOVar19->m_edge_count != 0) {
                      pOVar20 = pOVar19->m_edge4;
                      uVar18 = 0;
                      do {
                        pOVar9 = pOVar20;
                        if (3 < uVar18) {
                          pOVar9 = pOVar19->m_edgex + (uVar18 - 4);
                        }
                        pOVar14 = (ON_SubDEdge *)(pOVar9->m_ptr & 0xfffffffffffffff8);
                        bVar21 = IsValidSubDEdge(pOVar14,level,(uint *)&local_88,bSilentError);
                        if (!bVar21) goto LAB_005d92f9;
                        text_log = (ON_TextLog *)(ulong)bSilentError;
                        bVar21 = IsValidEdgeFaceLink(pOVar14,pOVar19,0xffffffff,(uint)uVar18,
                                                     bSilentError);
                        if (!bVar21) goto LAB_005d92f9;
                        uVar18 = uVar18 + 1;
                        pOVar20 = pOVar20 + 1;
                      } while (uVar18 < pOVar19->m_edge_count);
                    }
                    if (pOVar19->m_edge_count != 0) {
                      pOVar20 = pOVar19->m_edge4;
                      uVar18 = 0;
                      do {
                        pOVar9 = pOVar20;
                        if (3 < uVar18) {
                          pOVar9 = pOVar19->m_edgex + (uVar18 - 4);
                        }
                        uVar10 = pOVar9->m_ptr & 0xfffffffffffffff8;
                        if (uVar10 == 0) {
                          pOVar12 = (ON_SubDVertex *)0x0;
                        }
                        else {
                          pOVar12 = *(ON_SubDVertex **)
                                     (uVar10 + 0x80 + (ulong)((uint)pOVar9->m_ptr & 1) * 8);
                        }
                        bVar21 = IsValidSubDVertex(pOVar12,level,(uint *)&local_80,
                                                   (ushort)bSilentError,SUB81(text_log,0));
                        if (!bVar21) goto LAB_005d92f9;
                        text_log = (ON_TextLog *)(ulong)bSilentError;
                        bVar21 = IsValidVertexFaceLink
                                           (pOVar12,pOVar19,0xffffffff,(uint)uVar18,bSilentError);
                        if (!bVar21) goto LAB_005d92f9;
                        uVar18 = uVar18 + 1;
                        pOVar20 = pOVar20 + 1;
                      } while (uVar18 < pOVar19->m_edge_count);
                    }
                    pOVar19 = pOVar19->m_next_face;
                  } while (pOVar19 != (ON_SubDFace *)0x0);
                }
                for (pOVar14 = this_00->m_edge[0]; pOVar14 != (ON_SubDEdge *)0x0;
                    pOVar14 = pOVar14->m_next_edge) {
                  bVar21 = IsValidSubDEdgeTag(pOVar14,bSilentError);
                  if (!bVar21) goto LAB_005d92f9;
                }
                for (pOVar12 = this_00->m_vertex[0]; pOVar12 != (ON_SubDVertex *)0x0;
                    pOVar12 = pOVar12->m_next_vertex) {
                  bVar21 = IsValidSubDVertexTag(pOVar12,bSilentError);
                  if (!bVar21) goto LAB_005d92f9;
                }
                pOVar14 = this_00->m_edge[0];
                bVar6 = 1;
                if (pOVar14 != (ON_SubDEdge *)0x0) {
                  do {
                    ON_3dPoint::ON_3dPoint((ON_3dPoint *)local_68,pOVar14->m_vertex[0]->m_P);
                    ON_3dPoint::ON_3dPoint
                              ((ON_3dPoint *)(local_68 + 0x18),pOVar14->m_vertex[1]->m_P);
                    bVar21 = ON_3dPoint::operator!=
                                       ((ON_3dPoint *)local_68,(ON_3dPoint *)(local_68 + 0x18));
                    if (!bVar21) {
                      ON_ComponentStatus::SetDamagedState
                                (&(pOVar14->super_ON_SubDComponentBase).m_status,true);
                      ON_SubDIncrementErrorCount();
                      if (bSilentError) {
                        local_9c = 0;
                      }
                      else {
                        bVar22 = ON_IsNotValid();
                        local_9c = (uint)bVar22;
                      }
                    }
                    if (!bVar21) {
                      bVar6 = (byte)local_9c;
                      break;
                    }
                    pOVar14 = pOVar14->m_next_edge;
                  } while (pOVar14 != (ON_SubDEdge *)0x0);
                }
                goto LAB_005d92fb;
              }
            }
          }
        }
      }
LAB_005d9417:
      ON_SubDIncrementErrorCount();
    }
    if (!bSilentError) {
      bVar6 = ON_IsNotValid();
      goto LAB_005d92fb;
    }
  }
  else {
LAB_005d92f0:
    ON_SubDIncrementErrorCount();
joined_r0x005d931b:
    if (!bSilentError) {
      bVar21 = ON_IsNotValid();
      return bVar21;
    }
  }
LAB_005d92f9:
  bVar6 = 0;
LAB_005d92fb:
  return (bool)(bVar6 & 1);
}

Assistant:

bool ON_SubDimple::IsValidLevel(
  const ON_SubD& subd,
  unsigned int level_index,
  bool bSilentError,
  ON_TextLog* text_log
  ) const
{
  const unsigned int level_count = m_levels.UnsignedCount();
  if (level_index >= level_count || level_index >= 0xFFFF)
    return ON_SubDIsNotValid(bSilentError);
  const ON_SubDLevel* level = m_levels[level_index];
  if ( nullptr == level)
    return ON_SubDIsNotValid(bSilentError);
  level->ClearComponentDamagedState();

  if ( level->m_level_index != level_index)
    return ON_SubDIsNotValid(bSilentError);

  if (level_index <= 0)
  {
    if (level->m_vertex_count < 3)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_edge_count < 3)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_face_count < 1)
      return ON_SubDIsNotValid(bSilentError);
  }
  else
  {
    const ON_SubDLevel* previous_level = m_levels[level_index - 1];
    if (nullptr == previous_level)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_vertex_count <= previous_level->m_vertex_count)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_edge_count <= previous_level->m_edge_count)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_face_count <= previous_level->m_face_count)
      return ON_SubDIsNotValid(bSilentError);
  }

  if (nullptr == level->m_vertex[0])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_edge[0])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_face[0])
    return ON_SubDIsNotValid(bSilentError);

  if (nullptr == level->m_vertex[1])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_edge[1])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_face[1])
    return ON_SubDIsNotValid(bSilentError);


  const unsigned short expected_level = (unsigned short)level_index;
  unsigned int i;
  const ON_SubDVertex* vertex;
  const ON_SubDEdge* edge;
  const ON_SubDFace* face;

  unsigned int v_id_range[2] = { ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX };
  unsigned int e_id_range[2] = { ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX };
  unsigned int f_id_range[2] = { ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX };

  unsigned int point_vertex_count = 0;
  unsigned int wire_edge_count = 0;

  // simple vertex validation
  if (level_index == subd.ActiveLevelIndex())
  {
    if (subd.FirstVertex() != level->m_vertex[0])
      return ON_SubDIsNotValid(bSilentError);
    ON_SubDVertexIterator vit = subd.VertexIterator();
    if (vit.FirstVertex() != level->m_vertex[0])
      return ON_SubDIsNotValid(bSilentError);
    // IsValid() should not create these clunky cached arrays.
    //ON_SubDVertexArray va = subd.VertexArray();
    //if (va.VertexCount() != level->m_vertex_count)
    //  return ON_SubDIsNotValid(bSilentError);
    //if (va[0] != level->m_vertex[0])
    //  return ON_SubDIsNotValid(bSilentError);
    //if (va[level->m_vertex_count-1] != level->m_vertex[1])
    //  return ON_SubDIsNotValid(bSilentError);
  }
  const ON_SubDVertex* last_vertex = nullptr;
  for (i = 0, vertex = level->m_vertex[0]; i < level->m_vertex_count && nullptr != vertex; i++, vertex = vertex->m_next_vertex)
  {
    if (false == IsValidSubDVertex(vertex, expected_level, nullptr, level->m_ordinary_vertex_valence, bSilentError))
      return false;

    if (0 == i)
    {
      v_id_range[0] = v_id_range[1] = vertex->m_id;
    }
    else if (vertex->m_id < v_id_range[0])
      v_id_range[0] = vertex->m_id;
    else if (vertex->m_id > v_id_range[1])
      v_id_range[1] = vertex->m_id;

    if (0 == vertex->m_edge_count)
    {
      point_vertex_count++;
    }
    last_vertex = vertex;
  }
  if (level->m_vertex[1] != last_vertex)
    return ON_SubDIsNotValid(bSilentError);


  if (i != level->m_vertex_count || nullptr != vertex)
    return ON_SubDIsNotValid(bSilentError);
  if (1 + v_id_range[1] - v_id_range[0] < level->m_vertex_count)
    return ON_SubDIsNotValid(bSilentError);
  if ( v_id_range[1] > MaximumVertexId() )
    return ON_SubDIsNotValid(bSilentError);

  // currently, point vertices are not permitted
  if (point_vertex_count > 0)
    return ON_SubDIsNotValid(bSilentError);

  // simple edge validation
  if (level_index == subd.ActiveLevelIndex())
  {
    if (subd.FirstEdge() != level->m_edge[0])
      return ON_SubDIsNotValid(bSilentError);
    ON_SubDEdgeIterator eit = subd.EdgeIterator();
    if (eit.FirstEdge() != level->m_edge[0])
      return ON_SubDIsNotValid(bSilentError);

    // IsValid() should not create these clunky cached arrays.
    //ON_SubDEdgeArray ea = subd.EdgeArray();
    //if (ea.EdgeCount() != level->m_edge_count)
    //  return ON_SubDIsNotValid(bSilentError);
    //if (ea[0] != level->m_edge[0])
    //  return ON_SubDIsNotValid(bSilentError);
    //if (ea[level->m_edge_count-1] != level->m_edge[1])
    //  return ON_SubDIsNotValid(bSilentError);
  }
  const ON_SubDEdge* last_edge = nullptr;
  for (i = 0, edge = level->m_edge[0]; i < level->m_edge_count && nullptr != edge; i++, edge = edge->m_next_edge)
  {
    if (false == IsValidSubDEdge(edge, expected_level, nullptr, bSilentError))
      return false;
    if (0 == edge->m_face_count)
    {
      wire_edge_count++;
    }
    if (0 == i)
    {
      e_id_range[0] = e_id_range[1] = edge->m_id;
    }
    else if (edge->m_id < e_id_range[0])
      e_id_range[0] = edge->m_id;
    else if (edge->m_id > e_id_range[1])
      e_id_range[1] = edge->m_id;

    last_edge = edge;
  }
  if (i != level->m_edge_count || nullptr != edge)
    return ON_SubDIsNotValid(bSilentError);
  if (1 + e_id_range[1] - e_id_range[0] < level->m_edge_count)
    return ON_SubDIsNotValid(bSilentError);
  if (level->m_edge[1] != last_edge)
    return ON_SubDIsNotValid(bSilentError);
  if ( e_id_range[1] > MaximumEdgeId() )
    return ON_SubDIsNotValid(bSilentError);
   
  // As of November 12, 2019
  // Wire edges are permitted. THey exist in subds being edited.
  ////// currently, wire edges are not permitted
  ////if (wire_edge_count > 0)
  ////  return ON_SubDIsNotValid(bSilentError);
   
  // simple face validation
  if (level_index == subd.ActiveLevelIndex())
  {
    if (subd.FirstFace() != level->m_face[0])
      return ON_SubDIsNotValid(bSilentError);
    ON_SubDFaceIterator fit = subd.FaceIterator();
    if (fit.FirstFace() != level->m_face[0])
      return ON_SubDIsNotValid(bSilentError);
    // IsValid() should not create these clunky cached arrays.
    //ON_SubDFaceArray fa = subd.FaceArray();
    //if (fa.FaceCount() != level->m_face_count)
    //  return ON_SubDIsNotValid(bSilentError);
    //if (fa[0] != level->m_face[0])
    //  return ON_SubDIsNotValid(bSilentError);
    //if (fa[0] != level->m_face[0])
    //  return ON_SubDIsNotValid(bSilentError);
  }
  const ON_SubDFace* last_face = nullptr;
  for (i = 0, face = level->m_face[0]; i < level->m_face_count && nullptr != face; i++, face = face->m_next_face)
  {
    if (false == IsValidSubDFace(face, expected_level, nullptr, level->m_ordinary_face_edge_count, bSilentError))
      return false;

    if (0 == i)
    {
      f_id_range[0] = f_id_range[1] = face->m_id;
    }
    else if (face->m_id < f_id_range[0])
      f_id_range[0] = face->m_id;
    else if (face->m_id > f_id_range[1])
      f_id_range[1] = face->m_id;

    last_face = face;
  }
  if (i != level->m_face_count || nullptr != face)
    return ON_SubDIsNotValid(bSilentError);
  if (1 + f_id_range[1] - f_id_range[0] < level->m_face_count)
    return ON_SubDIsNotValid(bSilentError);  
  if (level->m_face[1] != last_face)
    return ON_SubDIsNotValid(bSilentError);
  if ( f_id_range[1] > MaximumFaceId() )
    return ON_SubDIsNotValid(bSilentError);


  // vertex topology validation
  for (vertex = level->m_vertex[0]; nullptr != vertex; vertex = vertex->m_next_vertex)
  {
    for (i = 0; i < vertex->m_edge_count; i++)
    {
      edge = vertex->Edge(i);
      if (false == IsValidSubDEdge(edge, expected_level, e_id_range, bSilentError))
        return false;
      if (false == IsValidVertexEdgeLink(vertex, edge, vertex->EdgeDirection(i), bSilentError))
        return false;
    }

    for (i = 0; i < vertex->m_face_count; i++)
    {
      face = vertex->Face(i);
      if (false == IsValidSubDFace(face, expected_level, f_id_range, level->m_ordinary_face_edge_count, bSilentError))
        return false;
      if (false == IsValidVertexFaceLink(vertex, face, i, ON_UNSET_UINT_INDEX, bSilentError))
        return false;
    }
  }

  // edge topology validation
  for (edge = level->m_edge[0]; nullptr != edge; edge = edge->m_next_edge)
  {
    for (i = 0; i < 2; i++)
    {
      vertex = edge->m_vertex[i];
      if (false == IsValidSubDVertex(vertex, expected_level, v_id_range, level->m_ordinary_vertex_valence, bSilentError))
        return false;
      if (false == IsValidVertexEdgeLink(vertex, edge, i, bSilentError))
        return false;
    }

    for (i = 0; i < edge->m_face_count; i++)
    {
      face = edge->Face(i);
      if (false == IsValidSubDFace(face, expected_level, f_id_range, level->m_ordinary_face_edge_count, bSilentError))
        return false;
      if (false == IsValidEdgeFaceLink(edge, face, i, ON_UNSET_UINT_INDEX, bSilentError))
        return false;
    }
  }

  // face topology validation
  for (face = level->m_face[0]; nullptr != face; face = face->m_next_face)
  {
    for (i = 0; i < face->m_edge_count; i++)
    {
      edge = face->Edge(i);
      if (false == IsValidSubDEdge(edge, expected_level, e_id_range, bSilentError))
        return false;
      if (false == IsValidEdgeFaceLink(edge, face, ON_UNSET_UINT_INDEX, i, bSilentError))
        return false;
    }

    for (i = 0; i < face->m_edge_count; i++)
    {
      vertex = face->Vertex(i);
      if (false == IsValidSubDVertex(vertex, expected_level, v_id_range, level->m_ordinary_vertex_valence, bSilentError))
        return false;
      if (false == IsValidVertexFaceLink(vertex, face, ON_UNSET_UINT_INDEX, i, bSilentError))
        return false;
    }
  }


  // edge tag validation
  for (edge = level->m_edge[0]; nullptr != edge; edge = edge->m_next_edge)
  {
    if (false == IsValidSubDEdgeTag(edge, bSilentError))
      return false;
  }

  // vertex tag validation
  for (vertex = level->m_vertex[0]; nullptr != vertex; vertex = vertex->m_next_vertex)
  {
    if (false == IsValidSubDVertexTag(vertex, bSilentError))
      return false;
  }

  // edge length validation
  for (edge = level->m_edge[0]; nullptr != edge; edge = edge->m_next_edge)
  {
    const ON_3dPoint P[2] = { edge->m_vertex[0]->ControlNetPoint(), edge->m_vertex[1]->ControlNetPoint() };
    if (false == (P[0] != P[1]))
    {
      edge->m_status.SetDamagedState(true);
      return ON_SubDIsNotValid(bSilentError);
    }
  }


  return true;
}